

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O0

Token * __thiscall embree::Stream<embree::Token>::peek(Stream<embree::Token> *this)

{
  long lVar1;
  runtime_error *this_00;
  reference pvVar2;
  long *in_RDI;
  size_t end;
  Token v;
  ParseLocation l;
  type in_stack_fffffffffffffe78;
  Token *in_stack_fffffffffffffe80;
  pair<embree::Token,_embree::ParseLocation> *this_01;
  Token *in_stack_fffffffffffffe88;
  pair<embree::Token,_embree::ParseLocation> *in_stack_fffffffffffffe90;
  pair<embree::Token,_embree::ParseLocation> local_128;
  ulong local_b8;
  pair<embree::Token,_embree::ParseLocation> *local_b0;
  undefined1 local_90 [72];
  undefined1 local_48 [40];
  pair<embree::Token,_embree::ParseLocation> *local_20;
  
  if (in_RDI[4] == 0) {
    local_20 = &local_128;
    (**(code **)(*in_RDI + 0x28))(local_48);
    (**(code **)(*in_RDI + 0x20))(local_90);
    std::pair<embree::Token,_embree::ParseLocation>::
    pair<embree::Token_&,_embree::ParseLocation_&,_true>
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
               (ParseLocation *)in_stack_fffffffffffffe80);
    Token::~Token(in_stack_fffffffffffffe80);
    ParseLocation::~ParseLocation((ParseLocation *)0x416bc3);
    this_01 = &local_128;
    local_b0 = this_01;
    if (in_RDI[3] + in_RDI[4] == 0x400) {
      if (in_RDI[3] == 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"stream buffer empty");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      in_RDI[2] = in_RDI[2] + 1U & 0x3ff;
      in_RDI[3] = in_RDI[3] + -1;
    }
    lVar1 = in_RDI[4];
    in_RDI[4] = lVar1 + 1;
    local_b8 = (ulong)((int)in_RDI[2] + (int)in_RDI[3] + (int)lVar1 & 0x3ff);
    std::
    vector<std::pair<embree::Token,_embree::ParseLocation>,_std::allocator<std::pair<embree::Token,_embree::ParseLocation>_>_>
    ::operator[]((vector<std::pair<embree::Token,_embree::ParseLocation>,_std::allocator<std::pair<embree::Token,_embree::ParseLocation>_>_>
                  *)(in_RDI + 5),local_b8);
    std::pair<embree::Token,_embree::ParseLocation>::operator=(this_01,in_stack_fffffffffffffe78);
    std::pair<embree::Token,_embree::ParseLocation>::~pair(this_01);
  }
  pvVar2 = std::
           vector<std::pair<embree::Token,_embree::ParseLocation>,_std::allocator<std::pair<embree::Token,_embree::ParseLocation>_>_>
           ::operator[]((vector<std::pair<embree::Token,_embree::ParseLocation>,_std::allocator<std::pair<embree::Token,_embree::ParseLocation>_>_>
                         *)(in_RDI + 5),in_RDI[2] + in_RDI[3] & 0x3ff);
  return &pvVar2->first;
}

Assistant:

const T& peek() {
      if (future == 0) push_back(nextHelper());
      return buffer[(start+past)%BUF_SIZE].first;
    }